

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNdr.c
# Opt level: O2

void Wln_NtkToNdrTest(Wln_Ntk_t *p)

{
  bool bVar1;
  FILE *__stream;
  Wln_Ntk_t *pWVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Ndr_Data_t *p_00;
  char **pNames;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  int *piVar9;
  char *pcVar10;
  int Type;
  int Type_00;
  int Type_01;
  int iVar11;
  int iVar12;
  long lVar13;
  char *__format;
  int iVar14;
  uint uVar15;
  uint *puVar16;
  ulong uVar17;
  Ndr_Data_t *p_1;
  int *local_60;
  void *local_58;
  uint *local_50;
  long local_48;
  ulong local_40;
  Wln_Ntk_t *local_38;
  
  p_00 = (Ndr_Data_t *)Wln_NtkToNdr(p);
  uVar17 = (ulong)(p->vTypes).nSize;
  pNames = (char **)malloc(uVar17 * 8 + 8);
  for (lVar13 = 1; __stream = _stdout, lVar13 < (int)uVar17; lVar13 = lVar13 + 1) {
    pcVar6 = Wln_ObjName(p,(int)lVar13);
    if (pcVar6 == (char *)0x0) {
      pcVar8 = (char *)0x0;
    }
    else {
      sVar7 = strlen(pcVar6);
      pcVar8 = (char *)malloc(sVar7 + 1);
      strcpy(pcVar8,pcVar6);
    }
    pNames[lVar13] = pcVar8;
    uVar17 = (ulong)(uint)(p->vTypes).nSize;
  }
  local_38 = p;
  if (_stdout == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n",0);
  }
  else {
    puVar16 = p_00->pBody;
    local_50 = puVar16;
    for (uVar17 = 1; iVar12 = (int)uVar17, iVar12 < (int)*puVar16;
        uVar17 = (ulong)(uint)(iVar12 + (int)uVar17)) {
      iVar3 = Ndr_DataType(p_00,iVar12);
      if (iVar3 == 2) {
        local_48 = (long)iVar12;
        iVar14 = 0;
        iVar3 = iVar12 + 1;
        for (iVar11 = iVar3; iVar11 < (int)(puVar16[local_48] + iVar12); iVar11 = iVar11 + iVar4) {
          iVar4 = Ndr_DataType(p_00,iVar11);
          if (iVar4 == 3) {
            iVar4 = Ndr_ObjIsType(p_00,iVar11,4);
            iVar14 = (iVar14 + 1) - (uint)(iVar4 == 0);
          }
          iVar4 = Ndr_DataSize(p_00,iVar11);
        }
        local_58 = malloc((long)iVar14 << 2);
        iVar11 = Ndr_ObjReadEntry(p_00,iVar12,Type);
        fprintf(__stream,"\nmodule %s (\n  ",pNames[iVar11]);
        for (iVar11 = iVar3; iVar11 < (int)(puVar16[local_48] + iVar12); iVar11 = iVar11 + iVar14) {
          iVar14 = Ndr_DataType(p_00,iVar11);
          if ((iVar14 == 3) && (iVar14 = Ndr_ObjIsType(p_00,iVar11,3), iVar14 != 0)) {
            pcVar6 = Ndr_ObjReadOutName(p_00,iVar11,pNames);
            fprintf(__stream,"%s, ",pcVar6);
          }
          iVar14 = Ndr_DataSize(p_00,iVar11);
        }
        fwrite("\n  ",3,1,__stream);
        bVar1 = true;
        for (iVar11 = iVar3; iVar11 < (int)(local_50[local_48] + iVar12); iVar11 = iVar11 + iVar14)
        {
          iVar14 = Ndr_DataType(p_00,iVar11);
          if ((iVar14 == 3) && (iVar14 = Ndr_ObjIsType(p_00,iVar11,4), iVar14 != 0)) {
            pcVar6 = "T = %d\t\t";
            if (!bVar1) {
              pcVar6 = "    \"%s\", ";
            }
            pcVar8 = Ndr_ObjReadInName(p_00,iVar11,pNames);
            bVar1 = false;
            fprintf(__stream,"%s%s",pcVar6 + 8,pcVar8);
          }
          iVar14 = Ndr_DataSize(p_00,iVar11);
        }
        fwrite("\n);\n\n",5,1,__stream);
        puVar16 = local_50;
        for (iVar11 = iVar3; uVar5 = puVar16[local_48], iVar11 < (int)(uVar5 + iVar12);
            iVar11 = iVar11 + iVar14) {
          iVar14 = Ndr_DataType(p_00,iVar11);
          if ((iVar14 == 3) && (iVar14 = Ndr_ObjIsType(p_00,iVar11,3), iVar14 != 0)) {
            fwrite("  input ",8,1,__stream);
            Ndr_ObjWriteRange(p_00,iVar11,(FILE *)__stream,1);
            pcVar6 = Ndr_ObjReadOutName(p_00,iVar11,pNames);
            fprintf(__stream," %s;\n",pcVar6);
          }
          iVar14 = Ndr_DataSize(p_00,iVar11);
        }
        uVar15 = 0;
        local_40 = uVar17;
        for (iVar12 = iVar3; iVar12 < (int)(uVar5 + (int)local_40); iVar12 = iVar12 + iVar11) {
          iVar11 = Ndr_DataType(p_00,iVar12);
          if ((iVar11 == 3) && (iVar11 = Ndr_ObjIsType(p_00,iVar12,4), iVar11 != 0)) {
            fwrite("  output ",9,1,__stream);
            Ndr_ObjWriteRange(p_00,iVar12,(FILE *)__stream,1);
            pcVar6 = Ndr_ObjReadInName(p_00,iVar12,pNames);
            puVar16 = local_50;
            fprintf(__stream," %s;\n",pcVar6);
            iVar11 = Ndr_ObjReadBody(p_00,iVar12,4);
            lVar13 = (long)(int)uVar15;
            uVar15 = uVar15 + 1;
            *(int *)((long)local_58 + lVar13 * 4) = iVar11;
          }
          iVar11 = Ndr_DataSize(p_00,iVar12);
          uVar5 = puVar16[local_48];
        }
        fputc(10,__stream);
        if ((int)uVar15 < 1) {
          uVar15 = 0;
        }
        for (iVar12 = iVar3; iVar12 < (int)(puVar16[local_48] + (int)local_40);
            iVar12 = iVar12 + iVar11) {
          iVar11 = Ndr_DataType(p_00,iVar12);
          if (((iVar11 == 3) && (iVar11 = Ndr_ObjIsType(p_00,iVar12,3), iVar11 == 0)) &&
             (iVar11 = Ndr_ObjIsType(p_00,iVar12,4), iVar11 == 0)) {
            uVar17 = 0;
            do {
              if (uVar15 == uVar17) {
                fwrite("  wire ",7,1,__stream);
                Ndr_ObjWriteRange(p_00,iVar12,(FILE *)__stream,1);
                pcVar6 = Ndr_ObjReadOutName(p_00,iVar12,pNames);
                fprintf(__stream," %s;\n",pcVar6);
                break;
              }
              iVar11 = *(int *)((long)local_58 + uVar17 * 4);
              iVar14 = Ndr_ObjReadBody(p_00,iVar12,5);
              uVar17 = uVar17 + 1;
              puVar16 = local_50;
            } while (iVar11 != iVar14);
          }
          iVar11 = Ndr_DataSize(p_00,iVar12);
        }
        free(local_58);
        fputc(10,__stream);
        uVar17 = local_40;
        for (; iVar3 < (int)(puVar16[local_48] + (int)uVar17); iVar3 = iVar3 + iVar12) {
          iVar12 = Ndr_DataType(p_00,iVar3);
          if (((iVar12 != 3) || (iVar12 = Ndr_ObjIsType(p_00,iVar3,3), iVar12 != 0)) ||
             (iVar12 = Ndr_ObjIsType(p_00,iVar3,4), iVar12 != 0)) goto LAB_002fd44c;
          iVar12 = Ndr_ObjReadBody(p_00,iVar3,6);
          if (0xff < iVar12) {
            iVar12 = Ndr_ObjReadEntry(p_00,iVar12 + -0x100,Type_00);
            fprintf(__stream,"  %s ",pNames[iVar12]);
            iVar12 = Ndr_ObjReadBody(p_00,iVar3,7);
            if (0 < iVar12) {
              iVar12 = Ndr_ObjReadBody(p_00,iVar3,7);
              fprintf(__stream,"%s ",pNames[iVar12]);
            }
            fwrite("( ",2,1,__stream);
            uVar15 = Ndr_ObjReadArray(p_00,iVar3,4,&local_60);
            piVar9 = local_60;
            uVar5 = uVar15;
            if ((int)uVar15 < 1) {
              uVar5 = 0;
            }
            for (uVar17 = 0; uVar5 != uVar17; uVar17 = uVar17 + 1) {
              pcVar6 = ",";
              if (uVar15 - 1 == uVar17) {
                pcVar6 = "";
              }
              fprintf(__stream,"%s%s ",pNames[piVar9[uVar17]],pcVar6);
            }
            pcVar6 = ");\n";
LAB_002fd096:
            fwrite(pcVar6,3,1,__stream);
            uVar17 = local_40;
            puVar16 = local_50;
            goto LAB_002fd44c;
          }
          switch(iVar12) {
          case 0x50:
            fprintf(__stream,"  %s ","ABC_READ");
            iVar12 = Ndr_ObjReadBody(p_00,iVar3,7);
            if (0 < iVar12) {
              iVar12 = Ndr_ObjReadBody(p_00,iVar3,7);
              fprintf(__stream,"%s ",pNames[iVar12]);
            }
            fwrite("( ",2,1,__stream);
            local_58 = (void *)CONCAT44(local_58._4_4_,iVar3);
            Ndr_ObjReadArray(p_00,iVar3,4,&local_60);
            pcVar6 = Ndr_ObjReadOutName(p_00,(int)local_58,pNames);
            fprintf(__stream,".data(%s), ",pcVar6);
            piVar9 = local_60;
            fprintf(__stream,".mem_in(%s), ",pNames[*local_60]);
            pcVar6 = pNames[piVar9[1]];
            pcVar8 = ".addr(%s) ";
            iVar3 = (int)local_58;
            break;
          case 0x51:
            fprintf(__stream,"  %s ","ABC_WRITE");
            iVar12 = Ndr_ObjReadBody(p_00,iVar3,7);
            if (0 < iVar12) {
              iVar12 = Ndr_ObjReadBody(p_00,iVar3,7);
              fprintf(__stream,"%s ",pNames[iVar12]);
            }
            fwrite("( ",2,1,__stream);
            local_58 = (void *)CONCAT44(local_58._4_4_,iVar3);
            Ndr_ObjReadArray(p_00,iVar3,4,&local_60);
            pcVar6 = Ndr_ObjReadOutName(p_00,(int)local_58,pNames);
            fprintf(__stream,".mem_out(%s), ",pcVar6);
            piVar9 = local_60;
            fprintf(__stream,".mem_in(%s), ",pNames[*local_60]);
            fprintf(__stream,".addr(%s), ",pNames[piVar9[1]]);
            pcVar6 = pNames[piVar9[2]];
            pcVar8 = ".data(%s) ";
            iVar3 = (int)local_58;
            break;
          default:
            pcVar6 = Ndr_ObjReadOutName(p_00,iVar3,pNames);
            fprintf(__stream,"  assign %s = ",pcVar6);
            uVar5 = Ndr_ObjReadArray(p_00,iVar3,4,&local_60);
            if (uVar5 == 0) {
              piVar9 = Ndr_ObjReadBodyP(p_00,iVar3,Type_01);
LAB_002fd546:
              fprintf(__stream,"%s;\n",piVar9);
              puVar16 = local_50;
            }
            else {
              if ((uVar5 == 1) && (iVar11 = Ndr_ObjReadBody(p_00,iVar3,6), iVar11 == 0xb)) {
                piVar9 = (int *)pNames[*local_60];
                goto LAB_002fd546;
              }
              puVar16 = local_50;
              piVar9 = local_60;
              if (iVar12 == 0x5c) {
                fputc(0x7b,__stream);
                piVar9 = local_60;
                uVar15 = uVar5;
                if ((int)uVar5 < 1) {
                  uVar15 = 0;
                }
                for (uVar17 = 0; uVar15 != uVar17; uVar17 = uVar17 + 1) {
                  pcVar6 = "    \"%s\", ";
                  if (uVar5 - 1 == uVar17) {
                    pcVar6 = "T = %d\t\t";
                  }
                  fprintf(__stream,"%s%s",pNames[piVar9[uVar17]],pcVar6 + 8);
                }
                pcVar6 = "};\n";
                goto LAB_002fd096;
              }
              if (iVar12 == 0x5b) {
                fputs(pNames[*local_60],__stream);
                Ndr_ObjWriteRange(p_00,iVar3,(FILE *)__stream,0);
                fwrite(";\n",2,1,__stream);
                puVar16 = local_50;
              }
              else if (uVar5 == 1) {
                iVar12 = Ndr_ObjReadBody(p_00,iVar3,6);
                pcVar6 = Abc_OperName(iVar12);
                fprintf(__stream,"%s %s;\n",pcVar6,pNames[*local_60]);
              }
              else {
                if (uVar5 == 2) {
                  pcVar6 = pNames[*local_60];
                  iVar12 = Ndr_ObjReadBody(p_00,iVar3,6);
                  pcVar10 = Abc_OperName(iVar12);
                  pcVar8 = pNames[piVar9[1]];
                  __format = "%s %s %s;\n";
                }
                else if (iVar12 == 0x32 && uVar5 == 3) {
                  pcVar6 = pNames[*local_60];
                  pcVar10 = pNames[local_60[1]];
                  pcVar8 = pNames[local_60[2]];
                  __format = "%s + %s + %s;\n";
                }
                else {
                  if (iVar12 != 0x15) {
                    iVar12 = Ndr_ObjReadBody(p_00,iVar3,6);
                    pcVar6 = Abc_OperName(iVar12);
                    fprintf(__stream,"<cannot write operation %s>;\n",pcVar6);
                    goto LAB_002fd44c;
                  }
                  pcVar6 = pNames[*local_60];
                  pcVar10 = pNames[local_60[1]];
                  pcVar8 = pNames[local_60[2]];
                  __format = "%s ? %s : %s;\n";
                }
                fprintf(__stream,__format,pcVar6,pcVar10,pcVar8);
              }
            }
            goto LAB_002fd44c;
          case 0x58:
            fprintf(__stream,"  %s ","ABC_DFF");
            iVar12 = Ndr_ObjReadBody(p_00,iVar3,7);
            if (0 < iVar12) {
              iVar12 = Ndr_ObjReadBody(p_00,iVar3,7);
              fprintf(__stream,"%s ",pNames[iVar12]);
            }
            fwrite("( ",2,1,__stream);
            local_58 = (void *)CONCAT44(local_58._4_4_,iVar3);
            Ndr_ObjReadArray(p_00,iVar3,4,&local_60);
            pcVar6 = Ndr_ObjReadOutName(p_00,(int)local_58,pNames);
            fprintf(__stream,".q(%s), ",pcVar6);
            piVar9 = local_60;
            fprintf(__stream,".d(%s), ",pNames[*local_60]);
            pcVar6 = pNames[piVar9[1]];
            pcVar8 = ".init(%s) ";
            iVar3 = (int)local_58;
            break;
          case 0x59:
            fprintf(__stream,"  %s ","ABC_DFFRSE");
            iVar12 = Ndr_ObjReadBody(p_00,iVar3,7);
            if (0 < iVar12) {
              iVar12 = Ndr_ObjReadBody(p_00,iVar3,7);
              fprintf(__stream,"%s ",pNames[iVar12]);
            }
            local_58 = (void *)CONCAT44(local_58._4_4_,iVar3);
            fwrite("( ",2,1,__stream);
            Ndr_ObjReadArray(p_00,(int)local_58,4,&local_60);
            pcVar6 = Ndr_ObjReadOutName(p_00,(int)local_58,pNames);
            fprintf(__stream,".q(%s), ",pcVar6);
            piVar9 = local_60;
            fprintf(__stream,".d(%s), ",pNames[*local_60]);
            fprintf(__stream,".clk(%s), ",pNames[piVar9[1]]);
            fprintf(__stream,".reset(%s), ",pNames[piVar9[2]]);
            fprintf(__stream,".set(%s), ",pNames[piVar9[3]]);
            fprintf(__stream,".enable(%s), ",pNames[piVar9[4]]);
            fprintf(__stream,".async(%s), ",pNames[piVar9[5]]);
            fprintf(__stream,".sre(%s), ",pNames[piVar9[6]]);
            fprintf(__stream,".init(%s) ",pNames[piVar9[7]]);
            iVar3 = (int)local_58;
            goto LAB_002fd444;
          }
          fprintf(__stream,pcVar8,pcVar6);
LAB_002fd444:
          fwrite(");\n",3,1,__stream);
LAB_002fd44c:
          iVar12 = Ndr_DataSize(p_00,iVar3);
        }
        fwrite("\nendmodule\n\n",0xc,1,__stream);
      }
      iVar12 = Ndr_DataSize(p_00,(int)uVar17);
    }
  }
  Ndr_Write("test.ndr",p_00);
  Ndr_Delete(p_00);
  pWVar2 = local_38;
  for (lVar13 = 1; lVar13 < (pWVar2->vTypes).nSize; lVar13 = lVar13 + 1) {
    if (pNames[lVar13] != (char *)0x0) {
      free(pNames[lVar13]);
      pNames[lVar13] = (char *)0x0;
    }
  }
  free(pNames);
  return;
}

Assistant:

void Wln_NtkToNdrTest( Wln_Ntk_t * p )
{
    // transform
    void * pDesign = Wln_NtkToNdr( p );

    // collect names     
    char ** ppNames = ABC_ALLOC( char *, Wln_NtkObjNum(p) + 1 ); int i;
    Wln_NtkForEachObj( p, i ) 
        ppNames[i] = Abc_UtilStrsav(Wln_ObjName(p, i));

    // verify by writing Verilog
    Ndr_WriteVerilog( NULL, pDesign, ppNames );
    Ndr_Write( "test.ndr", pDesign );

    // cleanup
    Ndr_Delete( pDesign );
    Wln_NtkForEachObj( p, i ) 
        ABC_FREE( ppNames[i] );
    ABC_FREE( ppNames );
}